

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundCommand.cpp
# Opt level: O2

void __thiscall senjo::TestCommandHandle::Execute(TestCommandHandle *this)

{
  int iVar1;
  ChessEngine *pCVar2;
  TestCommandHandle *pTVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  char *pcVar11;
  undefined4 extraout_var;
  char *pcVar12;
  size_type sVar13;
  int *piVar14;
  char cVar15;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  int iVar16;
  FILE *pFVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  char *f;
  int local_41c4;
  Output local_41c0;
  TestCommandHandle *local_41b8;
  int local_41b0;
  int local_41ac;
  int local_41a8;
  int local_41a4;
  FILE *local_41a0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  avoid;
  int local_4168;
  int local_4164;
  int seldepth;
  int depth;
  undefined8 local_4158;
  double dStack_4150;
  double local_4148;
  double dStack_4140;
  long local_4130;
  long local_4128;
  ulong local_4120;
  uint64_t time;
  uint64_t qnodes;
  uint64_t nodes;
  string bestmove;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  best;
  MoveFinder moveFinder;
  char fen [16384];
  
  if ((this->super_BackgroundCommand).engine == (ChessEngine *)0x0) {
    Output::Output((Output *)fen,InfoPrefix);
    std::operator<<((ostream *)&std::cout,"Engine not set for \'test\' command");
  }
  else {
    if ((this->fileName)._M_string_length != 0) {
      depth = 0;
      seldepth = 0;
      nodes = 0;
      qnodes = 0;
      time = 0;
      MoveFinder::MoveFinder(&moveFinder);
      local_41a0 = fopen((this->fileName)._M_dataplus._M_p,"r");
      if (local_41a0 != (FILE *)0x0) {
        (*((this->super_BackgroundCommand).engine)->_vptr_ChessEngine[0x1e])();
        (*((this->super_BackgroundCommand).engine)->_vptr_ChessEngine[0x22])();
        local_4130 = 0;
        local_4128 = 0;
        local_4120 = 0;
        local_41c4 = 0;
        local_4158 = (double)((ulong)local_4158._4_4_ << 0x20);
        local_41ac = -1;
        local_41b0 = 0;
        local_41a8 = 0;
        iVar16 = 0;
        local_4168 = 0;
        local_4164 = 0;
        pFVar17 = local_41a0;
        iVar9 = 0;
        local_41b8 = this;
        local_41a4 = local_41ac;
        while( true ) {
          iVar16 = iVar16 + 1;
          pcVar11 = fgets(fen,0x4000,pFVar17);
          if (pcVar11 == (char *)0x0) break;
          f = fen;
          pcVar11 = NextWord(&f);
          if ((*pcVar11 != '\0') && (*f != '#')) {
            iVar1 = iVar9 + 1;
            if ((local_41b8->skipCount == 0) ||
               (bVar8 = local_41b8->skipCount <= iVar9, pFVar17 = local_41a0, iVar9 = iVar1, bVar8))
            {
              Output::Output((Output *)&avoid,InfoPrefix);
              std::operator<<((ostream *)&std::cout,"--- Test ");
              local_41c4 = local_41c4 + 1;
              std::ostream::operator<<((ostream *)&std::cout,local_41c4);
              std::operator<<((ostream *)&std::cout," at line ");
              std::ostream::operator<<((ostream *)&std::cout,iVar16);
              std::operator<<((ostream *)&std::cout,' ');
              std::operator<<((ostream *)&std::cout,f);
              Output::~Output((Output *)&avoid);
              NormalizeString(&f);
              pCVar2 = (local_41b8->super_BackgroundCommand).engine;
              iVar9 = (*pCVar2->_vptr_ChessEngine[9])(pCVar2,f);
              if (((char *)CONCAT44(extraout_var,iVar9) == (char *)0x0) ||
                 (bVar8 = MoveFinder::LoadFEN(&moveFinder,f), !bVar8)) break;
              avoid._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              avoid._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              avoid._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &avoid._M_t._M_impl.super__Rb_tree_header._M_header;
              avoid._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              best._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              best._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              best._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &best._M_t._M_impl.super__Rb_tree_header._M_header;
              best._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              f = (char *)CONCAT44(extraout_var,iVar9);
              avoid._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   avoid._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              best._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   best._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_0013c7d2:
              pcVar12 = NextWord(&f);
              pcVar11 = f;
              if (*pcVar12 != '\0') {
                pcVar12 = strchr(f,0x3b);
                if (pcVar12 != (char *)0x0) {
                  *pcVar12 = '\0';
                  pcVar11 = f;
                }
                if (*pcVar11 == 'b') {
                  if ((pcVar11[1] == 'm') && (pcVar11[2] == ' ')) {
                    f = pcVar11 + 3;
                    while (pcVar11 = NextWord(&f), *pcVar11 != '\0') {
                      MoveFinder::ToCoordinates_abi_cxx11_(&bestmove,&moveFinder,&f);
                      if (bestmove._M_string_length == 0) goto LAB_0013c8e2;
                      std::
                      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      ::_M_insert_unique<std::__cxx11::string_const&>
                                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                  *)&best,&bestmove);
                      std::__cxx11::string::~string((string *)&bestmove);
                    }
                  }
                }
                else if (((*pcVar11 == 'a') && (pcVar11[1] == 'm')) && (pcVar11[2] == ' ')) {
                  f = pcVar11 + 3;
                  while (pcVar11 = NextWord(&f), *pcVar11 != '\0') {
                    MoveFinder::ToCoordinates_abi_cxx11_(&bestmove,&moveFinder,&f);
                    if (bestmove._M_string_length == 0) goto LAB_0013c8e2;
                    std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string_const&>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)&avoid,&bestmove);
                    std::__cxx11::string::~string((string *)&bestmove);
                  }
                }
                goto LAB_0013c8ea;
              }
LAB_0013c8fc:
              pTVar3 = local_41b8;
              if (best._M_t._M_impl.super__Rb_tree_header._M_node_count == 0 &&
                  avoid._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
                Output::Output((Output *)&bestmove,InfoPrefix);
                std::operator<<((ostream *)&std::cout,"error at line ");
                std::ostream::operator<<((ostream *)&std::cout,iVar16);
                std::operator<<((ostream *)&std::cout,", no best or avoid moves specified");
                Output::~Output((Output *)&bestmove);
                cVar15 = '\x01';
              }
              else {
                if (local_41b8->noClear == false) {
                  (*((local_41b8->super_BackgroundCommand).engine)->_vptr_ChessEngine[0xe])();
                }
                if (pTVar3->printBoard == true) {
                  (*((pTVar3->super_BackgroundCommand).engine)->_vptr_ChessEngine[0xc])();
                }
                ChessEngine::Go(&bestmove,(pTVar3->super_BackgroundCommand).engine,pTVar3->maxDepth,
                                0,pTVar3->maxTime,0,0,0,0,(string *)0x0);
                Output::Output(&local_41c0,NoPrefix);
                std::operator<<((ostream *)&std::cout,"bestmove ");
                std::operator<<((ostream *)&std::cout,(string *)&bestmove);
                Output::~Output(&local_41c0);
                pCVar2 = (local_41b8->super_BackgroundCommand).engine;
                (*pCVar2->_vptr_ChessEngine[0x10])
                          (pCVar2,&depth,&seldepth,&nodes,&qnodes,&time,0,0,0);
                local_4148 = (double)local_41c4;
                if (((bestmove._M_string_length == 0) ||
                    ((best._M_t._M_impl.super__Rb_tree_header._M_node_count != 0 &&
                     (sVar13 = std::
                               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::count(&best,&bestmove), sVar13 == 0)))) ||
                   ((avoid._M_t._M_impl.super__Rb_tree_header._M_node_count != 0 &&
                    (sVar13 = std::
                              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::count(&avoid,&bestmove), sVar13 != 0)))) {
                  Output::Output(&local_41c0,InfoPrefix);
                  std::operator<<((ostream *)&std::cout,"--- FAILED! line ");
                  std::ostream::operator<<((ostream *)&std::cout,iVar16);
                  std::operator<<((ostream *)&std::cout," (");
                  std::ostream::_M_insert<double>(((double)(int)local_4158 / local_4148) * 100.0);
                  std::operator<<((ostream *)&std::cout,"%) ");
                  std::operator<<((ostream *)&std::cout,f);
                }
                else {
                  Output::Output(&local_41c0,InfoPrefix);
                  std::operator<<((ostream *)&std::cout,"--- Passed. line ");
                  std::ostream::operator<<((ostream *)&std::cout,iVar16);
                  std::operator<<((ostream *)&std::cout," (");
                  iVar9 = (int)local_4158 + 1;
                  local_4158 = (double)CONCAT44(local_4158._4_4_,iVar9);
                  std::ostream::_M_insert<double>(((double)iVar9 / local_4148) * 100.0);
                  std::operator<<((ostream *)&std::cout,"%) ");
                  std::operator<<((ostream *)&std::cout,f);
                }
                Output::~Output(&local_41c0);
                iVar4 = depth;
                iVar9 = seldepth;
                if (local_41a8 < depth) {
                  local_41a8 = depth;
                }
                iVar10 = local_41a4;
                if (depth < local_41a4) {
                  iVar10 = depth;
                }
                bVar8 = local_41a4 < 0;
                local_41a4 = iVar10;
                if (bVar8) {
                  local_41a4 = depth;
                }
                if (local_41b0 < seldepth) {
                  local_41b0 = seldepth;
                }
                iVar10 = local_41ac;
                if (seldepth < local_41ac) {
                  iVar10 = seldepth;
                }
                bVar8 = local_41ac < 0;
                local_41ac = iVar10;
                if (bVar8) {
                  local_41ac = seldepth;
                }
                local_4120 = local_4120 + nodes;
                local_4128 = local_4128 + qnodes;
                local_4130 = local_4130 + time;
                iVar10 = (*((local_41b8->super_BackgroundCommand).engine)->_vptr_ChessEngine[0x20])
                                   ();
                local_4148 = (double)CONCAT71(local_4148._1_7_,1);
                if ((char)iVar10 == '\0') {
                  local_4148 = (double)CONCAT71(local_4148._1_7_,
                                                local_41b8->maxCount <= local_41c4 &&
                                                local_41b8->maxCount != 0);
                }
                local_4164 = local_4164 + iVar4;
                local_4168 = local_4168 + iVar9;
                std::__cxx11::string::~string((string *)&bestmove);
                cVar15 = local_4148._0_1_;
              }
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~_Rb_tree(&best._M_t);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~_Rb_tree(&avoid._M_t);
              pFVar17 = local_41a0;
              iVar9 = iVar1;
              if (cVar15 != '\0') break;
            }
          }
        }
        Output::Output((Output *)&avoid,InfoPrefix);
        pFVar17 = local_41a0;
        std::operator<<((ostream *)&std::cout,"--- Completed ");
        uVar7 = local_4120;
        lVar6 = local_4128;
        lVar5 = local_4130;
        pTVar3 = local_41b8;
        iVar9 = local_41c4;
        std::ostream::operator<<((ostream *)&std::cout,local_41c4);
        std::operator<<((ostream *)&std::cout," test positions");
        Output::~Output((Output *)&avoid);
        Output::Output((Output *)&avoid,InfoPrefix);
        std::operator<<((ostream *)&std::cout,"--- Passed    ");
        std::ostream::operator<<((ostream *)&std::cout,(int)local_4158);
        std::operator<<((ostream *)&std::cout," passed (");
        dVar18 = 0.0;
        if (iVar9 != 0) {
          dVar18 = ((double)(int)local_4158 / (double)iVar9) * 100.0;
        }
        std::ostream::_M_insert<double>(dVar18);
        std::operator<<((ostream *)&std::cout,"%)");
        Output::~Output((Output *)&avoid);
        Output::Output((Output *)&avoid,InfoPrefix);
        std::operator<<((ostream *)&std::cout,"--- Time      ");
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::operator<<((ostream *)&std::cout," (");
        auVar19._8_4_ = (int)((ulong)lVar5 >> 0x20);
        auVar19._0_8_ = lVar5;
        auVar19._12_4_ = 0x45300000;
        dStack_4140 = auVar19._8_8_ - 1.9342813113834067e+25;
        local_4148 = dStack_4140 + ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0);
        auVar20._8_4_ = iVar9 >> 0x1f;
        auVar20._0_8_ = (long)iVar9;
        auVar20._12_4_ = 0x45300000;
        dStack_4150 = auVar20._8_8_ - 1.9342813113834067e+25;
        local_4158 = dStack_4150 + ((double)CONCAT44(0x43300000,iVar9) - 4503599627370496.0);
        dVar18 = 0.0;
        if (iVar9 != 0) {
          dVar18 = local_4148 / local_4158;
        }
        std::ostream::_M_insert<double>(dVar18);
        std::operator<<((ostream *)&std::cout," avg)");
        Output::~Output((Output *)&avoid);
        Output::Output((Output *)&avoid,InfoPrefix);
        std::operator<<((ostream *)&std::cout,"--- Nodes     ");
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::operator<<((ostream *)&std::cout,", ");
        dVar18 = 0.0;
        if (lVar5 != 0) {
          dVar18 = ((double)(uVar7 / 1000) / local_4148) * 1000.0;
        }
        std::ostream::_M_insert<double>(dVar18);
        std::operator<<((ostream *)&std::cout," KNodes/sec");
        Output::~Output((Output *)&avoid);
        Output::Output((Output *)&avoid,InfoPrefix);
        std::operator<<((ostream *)&std::cout,"--- QNodes    ");
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::operator<<((ostream *)&std::cout," (");
        dVar18 = 0.0;
        if (uVar7 != 0) {
          auVar23._8_4_ = (int)((ulong)lVar6 >> 0x20);
          auVar23._0_8_ = lVar6;
          auVar23._12_4_ = 0x45300000;
          auVar24._8_4_ = (int)(uVar7 >> 0x20);
          auVar24._0_8_ = uVar7;
          auVar24._12_4_ = 0x45300000;
          dVar18 = (((auVar23._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) /
                   ((auVar24._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0))) * 100.0;
        }
        std::ostream::_M_insert<double>(dVar18);
        std::operator<<((ostream *)&std::cout,"%)");
        Output::~Output((Output *)&avoid);
        Output::Output((Output *)&avoid,InfoPrefix);
        std::operator<<((ostream *)&std::cout,"--- Depth     ");
        std::ostream::operator<<((ostream *)&std::cout,local_41a4);
        std::operator<<((ostream *)&std::cout," min, ");
        auVar21._8_4_ = local_4164 >> 0x1f;
        auVar21._0_8_ = (long)local_4164;
        auVar21._12_4_ = 0x45300000;
        iVar16 = (int)(((auVar21._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,local_4164) - 4503599627370496.0)) / local_4158)
        ;
        if (iVar9 == 0) {
          iVar16 = 0;
        }
        std::ostream::operator<<((ostream *)&std::cout,iVar16);
        std::operator<<((ostream *)&std::cout," avg, ");
        std::ostream::operator<<((ostream *)&std::cout,local_41a8);
        std::operator<<((ostream *)&std::cout," max");
        Output::~Output((Output *)&avoid);
        Output::Output((Output *)&avoid,InfoPrefix);
        std::operator<<((ostream *)&std::cout,"--- SelDepth  ");
        std::ostream::operator<<((ostream *)&std::cout,local_41ac);
        std::operator<<((ostream *)&std::cout," min, ");
        auVar22._8_4_ = local_4168 >> 0x1f;
        auVar22._0_8_ = (long)local_4168;
        auVar22._12_4_ = 0x45300000;
        iVar16 = (int)(((auVar22._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,local_4168) - 4503599627370496.0)) / local_4158)
        ;
        if (iVar9 == 0) {
          iVar16 = 0;
        }
        std::ostream::operator<<((ostream *)&std::cout,iVar16);
        std::operator<<((ostream *)&std::cout," avg, ");
        std::ostream::operator<<((ostream *)&std::cout,local_41b0);
        std::operator<<((ostream *)&std::cout," max");
        Output::~Output((Output *)&avoid);
        (*((pTVar3->super_BackgroundCommand).engine)->_vptr_ChessEngine[0x23])();
        fclose(pFVar17);
        return;
      }
      Output::Output((Output *)&avoid,InfoPrefix);
      std::operator<<((ostream *)&std::cout,"Cannot open \'");
      std::operator<<((ostream *)&std::cout,(string *)&this->fileName);
      std::operator<<((ostream *)&std::cout,"\': ");
      piVar14 = __errno_location();
      pcVar11 = strerror(*piVar14);
      std::operator<<((ostream *)&std::cout,pcVar11);
      this_00 = &avoid;
      goto LAB_0013d1dd;
    }
    Output::Output((Output *)fen,InfoPrefix);
    std::operator<<((ostream *)&std::cout,"FileName not set for \'test\' command");
  }
  this_00 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)fen;
LAB_0013d1dd:
  Output::~Output((Output *)this_00);
  return;
LAB_0013c8e2:
  std::__cxx11::string::~string((string *)&bestmove);
LAB_0013c8ea:
  if (pcVar12 == (char *)0x0) goto LAB_0013c8fc;
  f = pcVar12 + 1;
  goto LAB_0013c7d2;
}

Assistant:

void TestCommandHandle::Execute()
{
  if (!engine) {
    Output() << "Engine not set for 'test' command";
    return;
  }

  if (fileName.empty()) {
    Output() << "FileName not set for 'test' command";
    return;
  }

  char     fen[16384];
  int      depth = 0;
  int      line = 0;
  int      maxSearchDepth = 0;
  int      maxSeldepth = 0;
  int      minSearchDepth = -1;
  int      minSeldepth = -1;
  int      passed = 0;
  int      positions = 0;
  int      seldepth = 0;
  int      tested = 0;
  int      totalDepth = 0;
  int      totalSeldepth = 0;
  uint64_t nodes = 0;
  uint64_t qnodes = 0;
  uint64_t time = 0;
  uint64_t totalNodes = 0;
  uint64_t totalQnodes = 0;
  uint64_t totalTime = 0;
  FILE*    fp = NULL;

  try {
    MoveFinder moveFinder;

    if (!(fp = fopen(fileName.c_str(), "r"))) {
      Output() << "Cannot open '" << fileName << "': " << strerror(errno);
      return;
    }

    engine->ClearStopFlags();
    engine->ResetStatsTotals();

    while (fgets(fen, sizeof(fen), fp)) {
      line++;

      char* f = fen;
      if (!*NextWord(f) || (*f == '#')) {
        continue;
      }

      positions++;
      if (skipCount && (positions <= skipCount)) {
        continue;
      }

      Output() << "--- Test " << (++tested) << " at line " << line << ' ' << f;
      NormalizeString(f);
      const char* next = engine->SetPosition(f);
      if (!next || !moveFinder.LoadFEN(f)) {
        break;
      }
      f += (next - f);

      // consume 'am' and 'bm' parameters
      std::set<std::string> avoid;
      std::set<std::string> best;
      while (f && *NextWord(f)) {
        // null terminate this parameter (parameters end with ; or end of line)
        char* end = strchr(f, ';');
        if (end) {
          *end = 0;
        }

        if (!strncmp(f, "am ", 3)) {
          f += 3;
          while (*NextWord(f)) {
            std::string coord = moveFinder.ToCoordinates(f);
            if (coord.size()) {
              avoid.insert(coord);
            }
            else {
              break;
            }
          }
        }
        else if (!strncmp(f, "bm ", 3)) {
          f += 3;
          while (*NextWord(f)) {
            std::string coord = moveFinder.ToCoordinates(f);
            if (coord.size()) {
              best.insert(coord);
            }
            else {
              break;
            }
          }
        }

        // move 'f' to beginning of next parameter
        if (end) {
          f = (end + 1);
          continue;
        }
        break;
      }

      if (avoid.empty() && best.empty()) {
        Output() << "error at line " << line
                 << ", no best or avoid moves specified";
        break;
      }

      if (!noClear) {
        engine->ClearSearchData();
      }
      if (printBoard) {
        engine->PrintBoard();
      }

      const std::string bestmove = engine->Go(maxDepth, 0, maxTime);
      Output(Output::NoPrefix) << "bestmove " << bestmove;

      engine->GetStats(&depth, &seldepth, &nodes, &qnodes, &time);
      if (bestmove.empty() ||
          (best.size() && !best.count(bestmove)) ||
          (avoid.size() && avoid.count(bestmove)))
      {
        Output() << "--- FAILED! line " << line << " ("
                 << Percent(passed, tested) << "%) " << f;
      }
      else {
        passed++;
        Output() << "--- Passed. line " << line << " ("
                 << Percent(passed, tested) << "%) " << f;
      }

      if (depth > maxSearchDepth) {
        maxSearchDepth = depth;
      }
      if ((minSearchDepth < 0) || (depth < minSearchDepth)) {
        minSearchDepth = depth;
      }
      if (seldepth > maxSeldepth) {
        maxSeldepth = seldepth;
      }
      if ((minSeldepth < 0) || (seldepth < minSeldepth)) {
        minSeldepth = seldepth;
      }
      totalDepth += depth;
      totalNodes += nodes;
      totalQnodes += qnodes;
      totalSeldepth += seldepth;
      totalTime += time;

      if (engine->StopRequested() || (maxCount && (tested >= maxCount))) {
        break;
      }
    }

    Output() << "--- Completed " << tested << " test positions";
    Output() << "--- Passed    " << passed << " passed ("
             << Percent(passed, tested) << "%)";
    Output() << "--- Time      " << totalTime << " ("
             << Average(totalTime, static_cast<uint64_t>(tested)) << " avg)";
    Output() << "--- Nodes     " << totalNodes << ", "
             << Rate((totalNodes / 1000), totalTime) << " KNodes/sec";
    Output() << "--- QNodes    " << totalQnodes << " ("
             << Percent(totalQnodes, totalNodes) << "%)";
    Output() << "--- Depth     " << minSearchDepth << " min, "
             << static_cast<int>(Average(totalDepth, tested)) << " avg, "
             << maxSearchDepth << " max";
    Output() << "--- SelDepth  " << minSeldepth << " min, "
             << static_cast<int>(Average(totalSeldepth, tested)) << " avg, "
             << maxSeldepth << " max";

    engine->ShowStatsTotals();
  }
  catch (const std::exception& e) {
    Output() << "ERROR: " << e.what();
  }
  catch (...) {
    Output() << "Unknown error!";
  }

  if (fp) {
    fclose(fp);
    fp = NULL;
  }
}